

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GLMClassifier.pb.cc
# Opt level: O3

bool __thiscall
CoreML::Specification::GLMClassifier::MergePartialFromCodedStream
          (GLMClassifier *this,CodedInputStream *input)

{
  byte *pbVar1;
  byte bVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  int iVar6;
  uint32 uVar7;
  Type *this_00;
  StringVector *this_01;
  Int64Vector *this_02;
  pair<int,_int> pVar8;
  char cVar9;
  uint uVar10;
  ulong uVar11;
  
LAB_001e7b13:
  do {
    pbVar3 = input->buffer_;
    uVar7 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar2 = *pbVar3;
      uVar11 = (ulong)bVar2;
      pbVar1 = pbVar3 + 1;
      uVar10 = (uint)bVar2;
      if ((char)bVar2 < '\x01') {
        uVar7 = (uint)bVar2;
        if ((input->buffer_end_ <= pbVar1) || (uVar7 = uVar10, (~(uint)*pbVar1 & uVar10) < 0x80))
        goto LAB_001e7dff;
        uVar11 = (ulong)((uVar10 + (uint)*pbVar1 * 0x80) - 0x80);
        input->buffer_ = pbVar3 + 2;
      }
      else {
        input->buffer_ = pbVar1;
      }
      uVar11 = uVar11 | 0x100000000;
    }
    else {
LAB_001e7dff:
      uVar7 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar7);
      uVar11 = 0;
      if (uVar7 - 1 < 0x3fff) {
        uVar11 = 0x100000000;
      }
      uVar11 = uVar7 | uVar11;
    }
    uVar7 = (uint32)uVar11;
    if ((uVar11 & 0x100000000) == 0) goto LAB_001e7b70;
    uVar10 = (uint)(uVar11 >> 3) & 0x1fffffff;
    cVar9 = (char)uVar11;
    switch(uVar10) {
    case 1:
      if (cVar9 == '\n') {
        this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<CoreML::Specification::GLMClassifier_DoubleArray>::TypeHandler>
                            (&(this->weights_).super_RepeatedPtrFieldBase,(Type *)0x0);
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < iVar6)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar8 < 0) {
          return false;
        }
        bVar5 = GLMClassifier_DoubleArray::MergePartialFromCodedStream(this_00,input);
        goto LAB_001e7dec;
      }
      break;
    case 2:
      if (cVar9 == '\x11') {
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadRepeatedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (1,0x12,input,&this->offset_);
      }
      else {
        if ((uVar7 & 0xff) != 0x12) break;
        bVar5 = google::protobuf::internal::WireFormatLite::
                ReadPackedPrimitive<double,(google::protobuf::internal::WireFormatLite::FieldType)1>
                          (input,&this->offset_);
      }
      goto LAB_001e7b90;
    case 3:
      if (cVar9 == '\x18') {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar11 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_001e7e25;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar7 = 0;
LAB_001e7e25:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->postevaluationtransform_ = (int)uVar11;
        goto LAB_001e7b13;
      }
      break;
    case 4:
      if (cVar9 == ' ') {
        pbVar3 = input->buffer_;
        if (pbVar3 < input->buffer_end_) {
          bVar2 = *pbVar3;
          uVar11 = (ulong)bVar2;
          uVar7 = (uint32)bVar2;
          if ((char)bVar2 < '\0') goto LAB_001e7e3f;
          input->buffer_ = pbVar3 + 1;
        }
        else {
          uVar7 = 0;
LAB_001e7e3f:
          uVar11 = google::protobuf::io::CodedInputStream::ReadVarint32Fallback(input,uVar7);
          if ((long)uVar11 < 0) {
            return false;
          }
        }
        this->classencoding_ = (int)uVar11;
        goto LAB_001e7b13;
      }
      break;
    default:
      if (uVar10 == 100) {
        if (cVar9 == '\"') {
          if (this->_oneof_case_[0] == 100) {
            this_01 = (this->ClassLabels_).stringclasslabels_;
          }
          else {
            clear_ClassLabels(this);
            this->_oneof_case_[0] = 100;
            this_01 = (StringVector *)operator_new(0x30);
            StringVector::StringVector(this_01);
            (this->ClassLabels_).stringclasslabels_ = this_01;
          }
          puVar4 = input->buffer_;
          if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < iVar6)) {
            input->buffer_ = puVar4 + 1;
          }
          else {
            iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
            if (iVar6 < 0) {
              return false;
            }
          }
          pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                            (input,iVar6);
          if ((long)pVar8 < 0) {
            return false;
          }
          bVar5 = StringVector::MergePartialFromCodedStream(this_01,input);
LAB_001e7dec:
          if (bVar5 == false) {
            return false;
          }
          bVar5 = google::protobuf::io::CodedInputStream::DecrementRecursionDepthAndPopLimit
                            (input,pVar8.first);
          goto LAB_001e7b90;
        }
      }
      else if ((uVar10 == 0x65) && (cVar9 == '*')) {
        if (this->_oneof_case_[0] == 0x65) {
          this_02 = (this->ClassLabels_).int64classlabels_;
        }
        else {
          clear_ClassLabels(this);
          this->_oneof_case_[0] = 0x65;
          this_02 = (Int64Vector *)operator_new(0x28);
          Int64Vector::Int64Vector(this_02);
          (this->ClassLabels_).int64classlabels_ = this_02;
        }
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (iVar6 = (int)(char)*puVar4, -1 < iVar6)) {
          input->buffer_ = puVar4 + 1;
        }
        else {
          iVar6 = google::protobuf::io::CodedInputStream::ReadVarintSizeAsIntFallback(input);
          if (iVar6 < 0) {
            return false;
          }
        }
        pVar8 = google::protobuf::io::CodedInputStream::IncrementRecursionDepthAndPushLimit
                          (input,iVar6);
        if ((long)pVar8 < 0) {
          return false;
        }
        bVar5 = Int64Vector::MergePartialFromCodedStream(this_02,input);
        goto LAB_001e7dec;
      }
    }
LAB_001e7b70:
    if (uVar7 == 0) {
      return true;
    }
    if ((uVar7 & 7) == 4) {
      return true;
    }
    bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar7);
LAB_001e7b90:
    if (bVar5 == false) {
      return false;
    }
  } while( true );
}

Assistant:

bool GLMClassifier::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.GLMClassifier)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(16383u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // repeated .CoreML.Specification.GLMClassifier.DoubleArray weights = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(10u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
                input, add_weights()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // repeated double offset = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(18u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadPackedPrimitive<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 input, this->mutable_offset())));
        } else if (static_cast< ::google::protobuf::uint8>(tag) ==
                   static_cast< ::google::protobuf::uint8>(17u)) {
          DO_((::google::protobuf::internal::WireFormatLite::ReadRepeatedPrimitiveNoInline<
                   double, ::google::protobuf::internal::WireFormatLite::TYPE_DOUBLE>(
                 1, 18u, input, this->mutable_offset())));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.GLMClassifier.PostEvaluationTransform postEvaluationTransform = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_postevaluationtransform(static_cast< ::CoreML::Specification::GLMClassifier_PostEvaluationTransform >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.GLMClassifier.ClassEncoding classEncoding = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {
          int value;
          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   int, ::google::protobuf::internal::WireFormatLite::TYPE_ENUM>(
                 input, &value)));
          set_classencoding(static_cast< ::CoreML::Specification::GLMClassifier_ClassEncoding >(value));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.StringVector stringClassLabels = 100;
      case 100: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(802u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_stringclasslabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
      case 101: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(810u)) {
          DO_(::google::protobuf::internal::WireFormatLite::ReadMessageNoVirtual(
               input, mutable_int64classlabels()));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.GLMClassifier)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.GLMClassifier)
  return false;
#undef DO_
}